

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

vector<Interval,_std::allocator<Interval>_> *
getTracked(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Database *database,
          Rules *rules,IntervalFilter *filter)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  int iVar4;
  _Alloc_hider __x;
  iterator it;
  iterator end;
  Interval latest;
  allocator<char> local_151;
  string local_150;
  iterator local_130;
  iterator local_110;
  Interval local_f0;
  
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Database::begin(&local_130,database);
  Database::end(&local_110,database);
  bVar1 = Database::iterator::operator!=(&local_130,&local_110);
  iVar2 = 0;
  if (bVar1) {
    psVar3 = Database::iterator::operator*[abi_cxx11_(&local_130);
    IntervalFactory::fromSerialization(&local_f0,psVar3);
    Database::iterator::operator++(&local_130);
    expandLatest((vector<Interval,_std::allocator<Interval>_> *)&local_150,&local_f0,rules);
    iVar4 = 0;
    for (__x._M_p = local_150._M_dataplus._M_p; iVar2 = iVar4,
        __x._M_p != (pointer)local_150._M_string_length; __x._M_p = __x._M_p + 0xc0) {
      iVar2 = (**filter->_vptr_IntervalFilter)(filter,__x._M_p);
      if ((char)iVar2 == '\0') {
        bVar1 = IntervalFilter::is_done(filter);
        iVar2 = iVar4 + 1;
        if (bVar1) break;
      }
      else {
        ((value_type *)__x._M_p)->id = iVar4 + 1;
        std::vector<Interval,_std::allocator<Interval>_>::push_back
                  (__return_storage_ptr__,(value_type *)__x._M_p);
      }
      iVar4 = iVar4 + 1;
    }
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)&local_150);
    Interval::~Interval(&local_f0);
  }
  do {
    iVar2 = iVar2 + 1;
    bVar1 = Database::iterator::operator!=(&local_130,&local_110);
    if (!bVar1) {
LAB_001416e1:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Loaded {1} tracked intervals",&local_151);
      format<unsigned_long>
                ((string *)&local_f0,&local_150,
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->
                       super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0xc0);
      debug((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_150);
      std::
      __reverse<__gnu_cxx::__normal_iterator<Interval*,std::vector<Interval,std::allocator<Interval>>>>
                ((__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      return __return_storage_ptr__;
    }
    psVar3 = Database::iterator::operator*[abi_cxx11_(&local_130);
    IntervalFactory::fromSerialization(&local_f0,psVar3);
    local_f0.id = iVar2;
    iVar4 = (**filter->_vptr_IntervalFilter)(filter,&local_f0);
    if ((char)iVar4 == '\0') {
      bVar1 = IntervalFilter::is_done(filter);
      if (bVar1) {
        Interval::~Interval(&local_f0);
        goto LAB_001416e1;
      }
    }
    else {
      std::vector<Interval,_std::allocator<Interval>_>::emplace_back<Interval>
                (__return_storage_ptr__,&local_f0);
    }
    Interval::~Interval(&local_f0);
    Database::iterator::operator++(&local_130);
  } while( true );
}

Assistant:

std::vector <Interval> getTracked (
  Database& database,
  const Rules& rules,
  IntervalFilter& filter)
{
  int current_id = 0;
  std::vector <Interval> intervals;

  auto it = database.begin ();
  auto end = database.end ();

  // Because the latest recorded interval may be expanded into synthetic
  // intervals, we'll handle it specially
  if (it != end )
  {
    Interval latest = IntervalFactory::fromSerialization (*it);
    ++it;

    for (auto& interval : expandLatest (latest, rules))
    {
      ++current_id;
      if (filter.accepts (interval))
      {
        interval.id = current_id;
        intervals.push_back (interval);
      }
      else if (filter.is_done ())
      {
        break;
      }
    }
  }

  for (; it != end; ++it)
  {
    Interval interval = IntervalFactory::fromSerialization (*it);
    interval.id = ++current_id;

    if (filter.accepts (interval))
    {
      intervals.push_back (std::move (interval));
    }
    else if (filter.is_done ())
    {
      // Since we are moving backwards in time, and the intervals are in sorted
      // order, if the filter is after the interval, we know there will be no
      // more matches
      break;
    }
  }

  debug (format ("Loaded {1} tracked intervals", intervals.size ()));

  // By default, intervals are sorted by id, but getTracked needs to return the
  // intervals sorted by date, which are ids in reverse order.
  std::reverse (intervals.begin (), intervals.end ());

  return intervals;
}